

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void Abc_FlowRetime_RemoveLatchBubbles(Abc_Obj_t *pLatch)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  uint uVar2;
  Abc_Obj_t *p;
  Abc_Obj_t *p_00;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pFaninOld;
  Abc_Obj_t *pInv;
  Abc_Obj_t *pBo;
  Abc_Obj_t *pBi;
  Abc_Ntk_t *pNtk;
  int bubble;
  Abc_Obj_t *pLatch_local;
  
  pNtk._4_4_ = 0;
  pNtk_00 = pManMR->pNtk;
  p = Abc_ObjFanin0(pLatch);
  p_00 = Abc_ObjFanout0(pLatch);
  iVar1 = Abc_ObjIsComplement(p);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pBi)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                  ,0x17b,"void Abc_FlowRetime_RemoveLatchBubbles(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsComplement(p_00);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pBo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                  ,0x17c,"void Abc_FlowRetime_RemoveLatchBubbles(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjFaninC0(p_00);
  if ((iVar1 != 0) && (iVar1 = Abc_ObjFanoutNum(p_00), 0 < iVar1)) {
    pNtk._4_4_ = 1;
    iVar1 = Abc_LatchIsInit0(pLatch);
    if (iVar1 == 0) {
      iVar1 = Abc_LatchIsInit1(pLatch);
      if (iVar1 != 0) {
        Abc_LatchSetInit0(pLatch);
      }
    }
    else {
      Abc_LatchSetInit1(pLatch);
    }
  }
  uVar2 = Abc_ObjFaninC0(pLatch);
  *(uint *)&p->field_0x14 =
       *(uint *)&p->field_0x14 & 0xfffffbff |
       ((*(uint *)&p->field_0x14 >> 10 & 1 ^ pNtk._4_4_ ^ uVar2) & 1) << 10;
  iVar1 = Abc_NtkIsStrash(pNtk_00);
  if ((iVar1 == 0) && (iVar1 = Abc_ObjFaninC0(p), iVar1 != 0)) {
    *(uint *)&p->field_0x14 = *(uint *)&p->field_0x14 & 0xfffffbff;
    pAVar3 = Abc_ObjFanin0(p);
    pAVar3 = Abc_NtkCreateNodeInv(pNtk_00,pAVar3);
    pFaninOld = Abc_ObjFanin0(p);
    Abc_ObjPatchFanin(p,pFaninOld,pAVar3);
  }
  *(uint *)&p_00->field_0x14 = *(uint *)&p_00->field_0x14 & 0xfffffbff;
  *(uint *)&pLatch->field_0x14 = *(uint *)&pLatch->field_0x14 & 0xfffffbff;
  return;
}

Assistant:

void
Abc_FlowRetime_RemoveLatchBubbles( Abc_Obj_t * pLatch ) {
  int bubble = 0;
  Abc_Ntk_t *pNtk = pManMR->pNtk;
  Abc_Obj_t *pBi, *pBo, *pInv;
      
  pBi = Abc_ObjFanin0(pLatch);
  pBo = Abc_ObjFanout0(pLatch);
  assert(!Abc_ObjIsComplement(pBi));
  assert(!Abc_ObjIsComplement(pBo));

  // push bubbles on BO into latch box
  if (Abc_ObjFaninC0(pBo) && Abc_ObjFanoutNum(pBo) > 0) {
    bubble = 1;
    if (Abc_LatchIsInit0(pLatch)) Abc_LatchSetInit1(pLatch);
    else if (Abc_LatchIsInit1(pLatch)) Abc_LatchSetInit0(pLatch);  
  }

  // absorb bubbles on BI
  pBi->fCompl0 ^= bubble ^ Abc_ObjFaninC0(pLatch);

  // convert bubble to INV if not AIG
  if (!Abc_NtkIsStrash( pNtk ) && Abc_ObjFaninC0(pBi)) {
    pBi->fCompl0 = 0;
    pInv = Abc_NtkCreateNodeInv( pNtk, Abc_ObjFanin0(pBi) );
    Abc_ObjPatchFanin( pBi, Abc_ObjFanin0(pBi), pInv );
  }

  pBo->fCompl0 = 0;
  pLatch->fCompl0 = 0;
}